

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_StageERKNoFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is)

{
  int iVar1;
  int iVar2;
  int iVar3;
  N_Vector z;
  ulong uVar4;
  long lVar5;
  
  iVar2 = mriStep_RKCoeffs(step_mem->MRIC,is,step_mem->stage_map,step_mem->Ae_row,step_mem->Ai_row);
  if (iVar2 == 0) {
    *step_mem->cvals = 1.0;
    z = ark_mem->ycur;
    *step_mem->Xvecs = z;
    if (is < 1) {
      iVar2 = 1;
    }
    else {
      iVar3 = step_mem->explicit_rhs;
      iVar1 = step_mem->implicit_rhs;
      iVar2 = 1;
      uVar4 = 0;
      do {
        if ((iVar3 != 0) && (lVar5 = (long)step_mem->stage_map[uVar4], -1 < lVar5)) {
          step_mem->cvals[iVar2] = ark_mem->h * step_mem->Ae_row[lVar5];
          step_mem->Xvecs[iVar2] = step_mem->Fse[lVar5];
          iVar2 = iVar2 + 1;
        }
        if ((iVar1 != 0) && (lVar5 = (long)step_mem->stage_map[uVar4], -1 < lVar5)) {
          step_mem->cvals[iVar2] = ark_mem->h * step_mem->Ai_row[lVar5];
          step_mem->Xvecs[iVar2] = step_mem->Fsi[lVar5];
          iVar2 = iVar2 + 1;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)is != uVar4);
      z = ark_mem->ycur;
    }
    iVar3 = N_VLinearCombination(iVar2,step_mem->cvals,step_mem->Xvecs,z);
    iVar2 = -0x1c;
    if (iVar3 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mriStep_StageERKNoFast(ARKodeMem ark_mem,
                           ARKodeMRIStepMem step_mem, int is)
{
  int retval, j, nvec;

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep ERK stage\n");
#endif

  /* determine effective ERK coefficients (store in cvals) */
  retval = mriStep_RKCoeffs(step_mem->MRIC, is, step_mem->stage_map,
                            step_mem->Ae_row, step_mem->Ai_row);
  if (retval != ARK_SUCCESS) { return(retval); }

  /* call fused vector operation to perform ERK update */
  step_mem->cvals[0] = ONE;
  step_mem->Xvecs[0] = ark_mem->ycur;
  nvec = 1;
  for (j = 0; j < is; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      step_mem->cvals[nvec] = ark_mem->h *
        step_mem->Ae_row[step_mem->stage_map[j]];
      step_mem->Xvecs[nvec] = step_mem->Fse[step_mem->stage_map[j]];
      nvec += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      step_mem->cvals[nvec] = ark_mem->h *
        step_mem->Ai_row[step_mem->stage_map[j]];
      step_mem->Xvecs[nvec] = step_mem->Fsi[step_mem->stage_map[j]];
      nvec += 1;
    }
  }
  /* Is there a case where we have an explicit update with Fsi? */

  retval = N_VLinearCombination(nvec, step_mem->cvals,
                                step_mem->Xvecs, ark_mem->ycur);
  if (retval != 0) return(ARK_VECTOROP_ERR);
  return(ARK_SUCCESS);
}